

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkExecEntry(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  TimeDependencies *this_00;
  int32_t *piVar1;
  bool bVar2;
  TimeState TVar3;
  long lVar4;
  pointer pDVar5;
  bool bVar6;
  byte bVar7;
  uint8_t uVar8;
  int iVar9;
  Time TVar10;
  long lVar11;
  DependencyInfo *pDVar12;
  DependencyInfo *pDVar13;
  int32_t responseSequenceCounter;
  GlobalFederateId GVar14;
  DependencyInfo *dep;
  pointer pDVar15;
  MessageProcessingResult MVar16;
  action_t startingAction;
  ActionMessage *pAVar17;
  TimeData *pTVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  TimeDependencies *__range5;
  byte bVar25;
  ActionMessage execgrant;
  ActionMessage local_e8;
  
  bVar25 = 0;
  if ((this->time_block).internalTimeCode < 1) {
    return CONTINUE_PROCESSING;
  }
  this_00 = &(this->super_BaseTimeCoordinator).dependencies;
  bVar6 = TimeDependencies::checkIfReadyForExecEntry
                    (this_00,this->iterating != NO_ITERATIONS,
                     (this->info).wait_for_current_time_updates);
  if (!bVar6) {
    if (this->iterating == NO_ITERATIONS) {
      return CONTINUE_PROCESSING;
    }
    if (this->hasInitUpdates != false) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
    bVar6 = TimeDependencies::checkIfReadyForExecEntry(this_00,false,false);
    if (!bVar6) {
      this->needSendAll = true;
      return CONTINUE_PROCESSING;
    }
    pDVar12 = getExecEntryMinFederate
                        (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                         NONE,(GlobalFederateId)0x8831d580);
    if (((pDVar12->fedID).gid != triggerFed.gid) &&
       (pDVar12 = TimeDependencies::getDependencyInfo(this_00,triggerFed),
       pDVar12->dependent != true)) {
      return CONTINUE_PROCESSING;
    }
    responseSequenceCounter = (pDVar12->super_TimeData).sequenceCounter;
    GVar14.gid = -2010000000;
    goto LAB_0035a5ab;
  }
  cVar24 = this->needSendAll;
  this->needSendAll = false;
  MVar16 = CONTINUE_PROCESSING;
  if (this->iterating - 1 < 2) {
    if ((this->iteration).super___atomic_base<int>._M_i < (this->info).maxIterations) {
      if (this->hasInitUpdates == false) {
        bVar6 = TimeDependencies::checkIfReadyForExecEntry
                          (this_00,false,(this->info).wait_for_current_time_updates);
        if ((bVar6) ||
           (((this->info).wait_for_current_time_updates == true &&
            (bVar6 = TimeDependencies::checkIfAllDependenciesArePastExec(this_00,true), bVar6))))
        goto LAB_0035a348;
        bVar6 = (this->info).wait_for_current_time_updates;
        bVar2 = (this->info).restrictive_time_policy;
        bVar21 = bVar6 ^ 1;
        bVar7 = 0x32;
        bVar25 = bVar2;
        if (bVar6 == false) {
          pDVar15 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar5 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pDVar15 != pDVar5) {
            bVar7 = 0x32;
            bVar19 = bVar2;
            bVar20 = bVar2;
            bVar22 = bVar21;
            do {
              cVar23 = '\0';
              bVar25 = bVar19;
              if (pDVar15->dependency == true) {
                TVar3 = (pDVar15->super_TimeData).mTimeState;
                if (TVar3 == initialized) {
                  cVar23 = '\x03';
                  bVar20 = 0;
                  bVar25 = 0;
                  bVar21 = 0;
                  bVar22 = 0;
                }
                else if (TVar3 < exec_requested) {
                  if ((pDVar15->super_TimeData).minFed.gid !=
                      (this->super_BaseTimeCoordinator).mSourceId.gid) {
                    bVar22 = 0;
                  }
                  bVar6 = (pDVar15->super_TimeData).responseSequenceCounter ==
                          (this->super_BaseTimeCoordinator).sequenceCounter;
                  bVar25 = bVar20;
                  if (!bVar6) {
                    bVar25 = 0;
                  }
                  bVar21 = 0;
                  if (bVar6) {
                    bVar21 = bVar22;
                  }
                  if ((bVar6 & bVar2) == 1) {
                    bVar25 = (pDVar15->super_TimeData).restrictionLevel;
                    if (bVar25 <= bVar7) {
                      bVar7 = bVar25;
                    }
                    cVar23 = '\0';
                    bVar25 = bVar19;
                    bVar21 = bVar22;
                  }
                  else {
                    cVar23 = !bVar6 * '\x03';
                    bVar20 = bVar25;
                    bVar22 = bVar21;
                  }
                }
              }
            } while ((cVar23 == '\0') && (pDVar15 = pDVar15 + 1, bVar19 = bVar25, pDVar15 != pDVar5)
                    );
          }
        }
        if ((bVar21 & 1) == 0) {
          if ((bVar25 & 1) != 0) {
            uVar8 = bVar7 + 1;
LAB_0035a702:
            this->currentRestrictionLevel = uVar8;
            piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
            *piVar1 = *piVar1 + 1;
            cVar24 = '\x01';
          }
        }
        else {
          if ((bVar2 == false) || (bVar7 != 0)) goto LAB_0035a348;
          uVar8 = '\x01';
          if (this->currentRestrictionLevel != '\x01') goto LAB_0035a702;
        }
      }
      else {
        MVar16 = ITERATING;
      }
    }
    else {
LAB_0035a348:
      MVar16 = (this->iterating == FORCE_ITERATION) * '\x02';
    }
  }
  else if (this->iterating == NO_ITERATIONS) {
    if ((this->info).wait_for_current_time_updates == true) {
      GVar14.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      generateMinTimeTotal
                ((TimeData *)&local_e8,this_00,
                 (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),GVar14,GVar14
                 ,(this->super_BaseTimeCoordinator).sequenceCounter);
      pAVar17 = &local_e8;
      pTVar18 = &this->total;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pTVar18->next).internalTimeCode = ((Time *)&pAVar17->messageAction)->internalTimeCode;
        pAVar17 = (ActionMessage *)((long)pAVar17 + (ulong)bVar25 * -0x10 + 8);
        pTVar18 = (TimeData *)((long)pTVar18 + (ulong)bVar25 * -0x10 + 8);
      }
      MVar16 = (0 < (this->total).next.internalTimeCode) * '\x02' + CONTINUE_PROCESSING;
    }
    else {
      MVar16 = NEXT_STEP;
    }
  }
  if (this->dynamicJoining == false) {
    if (MVar16 == ITERATING) {
      TimeDependencies::resetIteratingExecRequests(this_00);
      this->hasInitUpdates = false;
      LOCK();
      (this->iteration).super___atomic_base<int>._M_i =
           (this->iteration).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      ActionMessage::ActionMessage(&local_e8,cmd_exec_grant);
      local_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      local_e8.counter = (uint16_t)(this->iteration).super___atomic_base<int>._M_i;
      local_e8.source_handle.hid = 1;
      local_e8.flags._0_1_ = (byte)local_e8.flags | 1;
      transmitTimingMessages(this,&local_e8,(GlobalFederateId)0x8831d580);
      this->currentRestrictionLevel = '\0';
    }
    else {
      if (MVar16 != NEXT_STEP) goto LAB_0035a517;
      (this->time_granted).internalTimeCode = 0;
      (this->time_grantBase).internalTimeCode = 0;
      (this->super_BaseTimeCoordinator).executionMode = true;
      LOCK();
      (this->iteration).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      this->currentRestrictionLevel = '\0';
      ActionMessage::ActionMessage(&local_e8,cmd_exec_grant);
      local_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      local_e8.source_handle.hid = 1;
      transmitTimingMessages(this,&local_e8,(GlobalFederateId)0x8831d580);
    }
LAB_0035a50d:
    ActionMessage::~ActionMessage(&local_e8);
  }
  else if (MVar16 == NEXT_STEP) {
    (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
    iVar9 = BaseTimeCoordinator::dependencyCount(&this->super_BaseTimeCoordinator);
    if (iVar9 < 1) {
      lVar11 = 0;
    }
    else {
      TVar10 = generateAllowedTime(this,(this->total).next.internalTimeCode);
      lVar11 = (this->info).timeDelta.internalTimeCode;
      lVar4 = (this->info).period.internalTimeCode;
      if (lVar11 < lVar4) {
        lVar11 = lVar4;
      }
      lVar11 = TVar10.internalTimeCode - lVar11;
    }
    (this->time_granted).internalTimeCode = lVar11;
    (this->time_grantBase).internalTimeCode = lVar11;
    (this->super_BaseTimeCoordinator).executionMode = true;
    LOCK();
    (this->iteration).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    this->currentRestrictionLevel = '\0';
    startingAction = cmd_exec_grant;
    if (0 < (this->time_granted).internalTimeCode) {
      startingAction = cmd_time_grant;
    }
    ActionMessage::ActionMessage(&local_e8,startingAction);
    local_e8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    local_e8.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
    local_e8.source_handle.hid = 1;
    transmitTimingMessages(this,&local_e8,(GlobalFederateId)0x8831d580);
    goto LAB_0035a50d;
  }
LAB_0035a517:
  if (triggerFed.gid == -2010000000) {
    return MVar16;
  }
  if (triggerFed.gid == -1700000000) {
    return MVar16;
  }
  if (MVar16 != CONTINUE_PROCESSING) {
    return MVar16;
  }
  if (this->iterating == NO_ITERATIONS) {
    return CONTINUE_PROCESSING;
  }
  pDVar12 = getExecEntryMinFederate
                      (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                       NONE,(GlobalFederateId)0x8831d580);
  if (cVar24 == '\0') {
    if ((this->super_BaseTimeCoordinator).mSourceId.gid == triggerFed.gid) {
      return CONTINUE_PROCESSING;
    }
    GVar14.gid = (pDVar12->fedID).gid;
    if ((GVar14.gid == triggerFed.gid) && (pDVar12->dependent == true)) {
      responseSequenceCounter = (pDVar12->super_TimeData).sequenceCounter;
    }
    else {
      pDVar13 = TimeDependencies::getDependencyInfo(this_00,triggerFed);
      if (pDVar13->dependent != true) {
        return CONTINUE_PROCESSING;
      }
      GVar14.gid = (pDVar12->fedID).gid;
      responseSequenceCounter = (pDVar13->super_TimeData).sequenceCounter;
    }
  }
  else {
    responseSequenceCounter = (pDVar12->super_TimeData).sequenceCounter;
    GVar14.gid = (pDVar12->fedID).gid;
    triggerFed.gid = -2010000000;
  }
LAB_0035a5ab:
  sendUpdatedExecRequest(this,triggerFed,GVar14,responseSequenceCounter);
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkExecEntry(GlobalFederateId triggerFed)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (time_block <= timeZero) {
        return ret;
    }
    if (!dependencies.checkIfReadyForExecEntry(iterating != IterationRequest::NO_ITERATIONS,
                                               info.wait_for_current_time_updates)) {
        if (!hasInitUpdates) {
            if (triggerFed.isValid() && iterating != IterationRequest::NO_ITERATIONS) {
                if (dependencies.checkIfReadyForExecEntry(false, false)) {
                    // if we are just continuing but would have granted in other circumstances
                    const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
                    if (mfed.fedID == triggerFed) {
                        sendUpdatedExecRequest(triggerFed,
                                               GlobalFederateId{},
                                               mfed.sequenceCounter);
                    } else {
                        const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                        if (tfed->dependent) {
                            sendUpdatedExecRequest(triggerFed,
                                                   GlobalFederateId{},
                                                   tfed->sequenceCounter);
                        }
                    }
                } else {
                    needSendAll = true;
                }
            }
        }
        return ret;
    }
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (!info.wait_for_current_time_updates) {
                ret = MessageProcessingResult::NEXT_STEP;
            } else {
                // on wait for current time flag all other federates must have entered exec mode
                total = generateMinTimeTotal(dependencies,
                                             info.restrictive_time_policy || globalTime,
                                             mSourceId,
                                             mSourceId,
                                             sequenceCounter);
                if (total.next > timeZero) {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (iteration >= info.maxIterations) {
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ret = MessageProcessingResult::ITERATING;
                } else {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
                break;
            }
            if (hasInitUpdates) {
                ret = MessageProcessingResult::ITERATING;
            } else {
                if ((dependencies.checkIfReadyForExecEntry(false,
                                                           info.wait_for_current_time_updates)) ||
                    (info.wait_for_current_time_updates &&
                     dependencies.checkIfAllDependenciesArePastExec(true))) {
                    ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                        MessageProcessingResult::ITERATING :
                        MessageProcessingResult::NEXT_STEP;
                } else {
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.mTimeState == TimeState::initialized) {
                                allowed = false;
                                restrictionAdvance = false;
                                break;
                            }
                            if (dep.mTimeState >= TimeState::exec_requested) {
                                continue;
                            }
                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                    MessageProcessingResult::ITERATING :
                                    MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                MessageProcessingResult::ITERATING :
                                MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }
            break;
        default:
            break;
    }
    if (!dynamicJoining) {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            time_granted = timeZero;
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        } else if (ret == MessageProcessingResult::ITERATING) {
            dependencies.resetIteratingExecRequests();
            hasInitUpdates = false;
            ++iteration;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.counter = iteration;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            setActionFlag(execgrant, iteration_requested_flag);
            transmitTimingMessages(execgrant);
            currentRestrictionLevel = 0;
        }
    } else {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            updateTimeFactors();
            if (dependencyCount() > 0) {
                time_granted =
                    generateAllowedTime(total.next) - (std::max)(info.period, info.timeDelta);
            } else {
                time_granted = timeZero;
            }
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(time_granted > timeZero ? CMD_TIME_GRANT : CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.actionTime = time_granted;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        }
    }
    if (triggerFed.isValid() && ret == MessageProcessingResult::CONTINUE_PROCESSING &&
        iterating != IterationRequest::NO_ITERATIONS) {
        // if we are just continuing
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        if (sendAll) {
            sendUpdatedExecRequest(GlobalFederateId{}, mfed.fedID, mfed.sequenceCounter);
        } else {
            if (triggerFed != mSourceId) {
                if (triggerFed == mfed.fedID && mfed.dependent) {
                    sendUpdatedExecRequest(triggerFed, mfed.fedID, mfed.sequenceCounter);
                } else {
                    const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                    if (tfed->dependent) {
                        sendUpdatedExecRequest(triggerFed, mfed.fedID, tfed->sequenceCounter);
                    }
                }
            }
        }
    }
    return ret;
}